

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * prvTidyFindHEAD(TidyDocImpl *doc)

{
  Node *pNVar1;
  Node **ppNVar2;
  
  pNVar1 = prvTidyFindHTML(doc);
  if (pNVar1 != (Node *)0x0) {
    ppNVar2 = &pNVar1->content;
    while (pNVar1 = *ppNVar2, pNVar1 != (Node *)0x0) {
      if ((pNVar1->tag != (Dict *)0x0) && (pNVar1->tag->id == TidyTag_HEAD)) {
        return pNVar1;
      }
      ppNVar2 = &pNVar1->next;
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *TY_(FindHEAD)( TidyDocImpl* doc )
{
    Node *node = TY_(FindHTML)( doc );

    if ( node )
    {
        for ( node = node->content;
              node && !nodeIsHEAD(node); 
              node = node->next )
            /**/;
    }

    return node;
}